

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tquant_api.h
# Opt level: O2

void __thiscall
tquant::api::CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_>::CallResult
          (CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_> *this,string *a_msg)

{
  (this->value).
  super___shared_ptr<const_tquant::api::_TickArray<tquant::api::RawBar>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->value).
  super___shared_ptr<const_tquant::api::_TickArray<tquant::api::RawBar>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->msg,(string *)a_msg);
  return;
}

Assistant:

CallResult(const string& a_msg)
				: msg(a_msg)
			{
			}